

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O0

uint32 google::protobuf::internal::EndianHelper<4>::Load(void *p)

{
  uint32 tmp;
  void *p_local;
  
  return *p;
}

Assistant:

static uint32 Load(const void* p) {
    uint32 tmp;
    std::memcpy(&tmp, p, 4);
#ifndef PROTOBUF_LITTLE_ENDIAN
    tmp = bswap_32(tmp);
#endif
    return tmp;
  }